

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86_fma::create_pipeline_int8_x86(Convolution_x86_fma *this,Option *opt)

{
  float fVar1;
  Allocator *pAVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  void *pvVar5;
  int *piVar6;
  ulong uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  int num_input;
  uint uVar11;
  int iVar12;
  int kernel_h;
  int iVar13;
  _func_int *p_Var14;
  byte bVar15;
  bool bVar16;
  byte bVar17;
  float fVar18;
  
  p_Var14 = this->_vptr_Convolution_x86_fma[-3];
  uVar11 = *(uint *)(p_Var14 + 0x30 + (long)&(this->weight_winograd23_data).data);
  iVar12 = *(int *)(p_Var14 + 0x34 + (long)&(this->weight_winograd23_data).data);
  iVar13 = *(int *)(p_Var14 + 0x38 + (long)&(this->weight_winograd23_data).data);
  uVar7 = (long)*(int *)(p_Var14 + 0x1c + (long)&(this->weight_winograd43_data).data) /
          (long)(iVar13 * iVar12);
  uVar7 = (long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) / (long)(int)uVar11
  ;
  bVar15 = opt->use_packing_layout;
  num_input = (int)uVar7;
  if ((bool)bVar15 != true) {
    bVar16 = false;
    goto LAB_00208df2;
  }
  bVar16 = (uVar7 & 7) == 0;
  if ((uVar7 & 7) == 0 && (uVar11 & 3) == 0) {
    if (((iVar13 == 1 && iVar12 == 1) &&
        (*(int *)(p_Var14 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
       (((*(int *)(p_Var14 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
         ((*(int *)(p_Var14 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
          (*(int *)(p_Var14 + (long)&(this->weight_winograd43_data).data) == 1)))) ||
        ((*(int *)(p_Var14 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
         ((*(int *)(p_Var14 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2 &&
          (*(int *)(p_Var14 + (long)&(this->weight_winograd43_data).data) == 2)))))))) {
      iVar12 = 1;
      iVar13 = 1;
LAB_0020919c:
      convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse
                ((Mat *)(p_Var14 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,uVar11,iVar12,iVar13);
    }
    else if ((((opt->use_winograd_convolution == true) &&
              (((iVar13 == 3 && (iVar12 == 3)) && (opt->use_winograd43_convolution != false)))) &&
             (((*(int *)(p_Var14 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var14 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
              (*(int *)(p_Var14 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
            (*(int *)(p_Var14 + (long)&(this->weight_winograd43_data).data) == 1)) {
      conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse
                ((Mat *)(p_Var14 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_winograd43_data,num_input,uVar11,opt);
    }
    else {
      if (opt->use_sgemm_convolution == true) goto LAB_0020919c;
      convolution_transform_kernel_packed_int8_sse
                ((Mat *)(p_Var14 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_data_tm,num_input,uVar11,iVar12,iVar13,8,4);
    }
LAB_00208df2:
    bVar17 = bVar15 ^ 1;
  }
  else {
    bVar17 = (uVar11 & 3) != 0;
    bVar15 = bVar16;
    if ((!(bool)bVar17) && ((uVar7 & 7) != 0)) {
      if (iVar12 == 7) {
        if ((((iVar13 != 7) ||
             (*(int *)(p_Var14 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1)) ||
            (*(int *)(p_Var14 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
           ((*(int *)(p_Var14 + 0x44 + (long)&(this->weight_winograd23_data).data) != 2 ||
            (*(int *)(p_Var14 + (long)&(this->weight_winograd43_data).data) != 2))))
        goto LAB_00209270;
        iVar12 = 7;
        iVar13 = 7;
      }
      else if (iVar12 == 3) {
        if ((iVar13 != 3) ||
           ((((*(int *)(p_Var14 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1 ||
              (*(int *)(p_Var14 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
             ((*(int *)(p_Var14 + 0x44 + (long)&(this->weight_winograd23_data).data) != 1 ||
              (*(int *)(p_Var14 + (long)&(this->weight_winograd43_data).data) != 1)))) &&
            ((((*(int *)(p_Var14 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1 ||
               (*(int *)(p_Var14 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
              (*(int *)(p_Var14 + 0x44 + (long)&(this->weight_winograd23_data).data) != 2)) ||
             (*(int *)(p_Var14 + (long)&(this->weight_winograd43_data).data) != 2))))))
        goto LAB_00209270;
        iVar12 = 3;
        iVar13 = 3;
      }
      else if (((iVar12 == 1) && (iVar13 == 1)) &&
              ((((*(int *)(p_Var14 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
                 ((*(int *)(p_Var14 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
                  (*(int *)(p_Var14 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
                (*(int *)(p_Var14 + (long)&(this->weight_winograd43_data).data) == 1)) ||
               ((((*(int *)(p_Var14 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
                  (*(int *)(p_Var14 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
                 (*(int *)(p_Var14 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2)) &&
                (*(int *)(p_Var14 + (long)&(this->weight_winograd43_data).data) == 2)))))) {
        iVar12 = 1;
        iVar13 = 1;
      }
      else {
LAB_00209270:
        if (opt->use_sgemm_convolution != true) {
          convolution_transform_kernel_packed_int8_sse
                    ((Mat *)(p_Var14 + 0x30 + (long)&(this->weight_winograd63_data).data),
                     &this->weight_data_tm,num_input,uVar11,iVar12,iVar13,1,4);
          goto LAB_0020931c;
        }
      }
      convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse
                ((Mat *)(p_Var14 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,uVar11,iVar12,iVar13);
      goto LAB_0020931c;
    }
  }
  if ((bVar17 != 0) && (bVar16)) {
    p_Var14 = this->_vptr_Convolution_x86_fma[-3];
    iVar12 = *(int *)(p_Var14 + 0x34 + (long)&(this->weight_winograd23_data).data);
    if (((iVar12 == 1) &&
        (*(int *)(p_Var14 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
       (((((*(int *)(p_Var14 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var14 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var14 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)) &&
         (*(int *)(p_Var14 + (long)&(this->weight_winograd43_data).data) == 1)) ||
        ((((*(int *)(p_Var14 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var14 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var14 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2)) &&
         (*(int *)(p_Var14 + (long)&(this->weight_winograd43_data).data) == 2)))))) {
      iVar13 = *(int *)(p_Var14 + 0x30 + (long)&(this->weight_winograd23_data).data);
      iVar12 = 1;
      kernel_h = 1;
LAB_00208f24:
      convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse
                ((Mat *)(p_Var14 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,iVar13,iVar12,kernel_h);
    }
    else if ((((opt->use_winograd_convolution == true) && (iVar12 == 3)) &&
             ((opt->use_winograd43_convolution != false &&
              ((*(int *)(p_Var14 + 0x38 + (long)&(this->weight_winograd23_data).data) == 3 &&
               (*(int *)(p_Var14 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)))))) &&
            ((*(int *)(p_Var14 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
             ((*(int *)(p_Var14 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
              (*(int *)(p_Var14 + (long)&(this->weight_winograd43_data).data) == 1)))))) {
      conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse
                ((Mat *)(p_Var14 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_winograd43_data,num_input,
                 *(int *)(p_Var14 + 0x30 + (long)&(this->weight_winograd23_data).data),opt);
    }
    else {
      iVar13 = *(int *)(p_Var14 + 0x30 + (long)&(this->weight_winograd23_data).data);
      kernel_h = *(int *)(p_Var14 + 0x38 + (long)&(this->weight_winograd23_data).data);
      if (opt->use_sgemm_convolution == true) goto LAB_00208f24;
      convolution_transform_kernel_packed_int8_sse
                ((Mat *)(p_Var14 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_data_tm,num_input,iVar13,iVar12,kernel_h,8,1);
    }
  }
  if ((bVar17 & (bVar15 ^ 1)) != 1) goto LAB_0020931c;
  p_Var14 = this->_vptr_Convolution_x86_fma[-3];
  uVar11 = *(uint *)(p_Var14 + 0x34 + (long)&(this->weight_winograd23_data).data);
  if (((uVar11 == 1) && (*(int *)(p_Var14 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)
      ) && (((*(int *)(p_Var14 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
             (((*(int *)(p_Var14 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var14 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)) &&
              (*(int *)(p_Var14 + (long)&(this->weight_winograd43_data).data) == 1)))) ||
            ((((*(int *)(p_Var14 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var14 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
              (*(int *)(p_Var14 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2)) &&
             (*(int *)(p_Var14 + (long)&(this->weight_winograd43_data).data) == 2)))))) {
    iVar13 = *(int *)(p_Var14 + 0x30 + (long)&(this->weight_winograd23_data).data);
    uVar11 = 1;
    iVar12 = 1;
  }
  else {
    if ((((opt->use_winograd_convolution == true) && (uVar11 == 3)) &&
        (((opt->use_winograd23_convolution != false &&
          (((*(int *)(p_Var14 + 0x38 + (long)&(this->weight_winograd23_data).data) == 3 &&
            (*(int *)(p_Var14 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
           (*(int *)(p_Var14 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
         ((*(int *)(p_Var14 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
          (*(int *)(p_Var14 + (long)&(this->weight_winograd43_data).data) == 1)))))) &&
       ((0xf < num_input &&
        (0xf < *(int *)(p_Var14 + 0x30 + (long)&(this->weight_winograd23_data).data))))) {
      conv3x3s1_winograd23_transform_kernel_int8_sse
                ((Mat *)(p_Var14 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_winograd23_data,num_input,
                 *(int *)(p_Var14 + 0x30 + (long)&(this->weight_winograd23_data).data),
                 (Option *)(ulong)uVar11);
      goto LAB_0020931c;
    }
    if (opt->use_sgemm_convolution != true) {
      if (p_Var14 != (_func_int *)0xfffffffffffffeb0) {
        piVar6 = *(int **)(p_Var14 + 0x38 + (long)&(this->weight_winograd63_data).data);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (this->weight_data_tm).refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            pvVar5 = (this->weight_data_tm).data;
            pAVar2 = (this->weight_data_tm).allocator;
            if (pAVar2 == (Allocator *)0x0) {
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
              }
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data_tm).cstep = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
        (this->weight_data_tm).data = (void *)0x0;
        (this->weight_data_tm).refcount = (int *)0x0;
        (this->weight_data_tm).dims = 0;
        (this->weight_data_tm).w = 0;
        (this->weight_data_tm).h = 0;
        (this->weight_data_tm).d = 0;
        (this->weight_data_tm).c = 0;
        piVar6 = *(int **)(p_Var14 + 0x30 + (long)&(this->weight_winograd63_data).data + 8);
        (this->weight_data_tm).data =
             *(void **)(p_Var14 + 0x30 + (long)&(this->weight_winograd63_data).data);
        (this->weight_data_tm).refcount = piVar6;
        (this->weight_data_tm).elemsize =
             *(size_t *)(p_Var14 + 0x40 + (long)&(this->weight_winograd63_data).data);
        (this->weight_data_tm).elempack =
             *(int *)((long)&this->convolution_dilation1 + (long)p_Var14);
        (this->weight_data_tm).allocator =
             *(Allocator **)(p_Var14 + (long)&(this->scale_in_data).data);
        uVar8 = *(undefined8 *)(p_Var14 + 8 + (long)&(this->scale_in_data).data);
        uVar9 = *(undefined8 *)(p_Var14 + 8 + (long)&(this->scale_in_data).data + 8);
        (this->weight_data_tm).dims = (int)uVar8;
        (this->weight_data_tm).w = (int)((ulong)uVar8 >> 0x20);
        (this->weight_data_tm).h = (int)uVar9;
        (this->weight_data_tm).d = (int)((ulong)uVar9 >> 0x20);
        (this->weight_data_tm).c = *(int *)(p_Var14 + 0x18 + (long)&(this->scale_in_data).data);
        (this->weight_data_tm).cstep =
             *(size_t *)(p_Var14 + 0x20 + (long)&(this->scale_in_data).data);
      }
      goto LAB_0020931c;
    }
    iVar13 = *(int *)(p_Var14 + 0x30 + (long)&(this->weight_winograd23_data).data);
    iVar12 = *(int *)(p_Var14 + 0x38 + (long)&(this->weight_winograd23_data).data);
  }
  convolution_im2col_sgemm_transform_kernel_int8_sse
            ((Mat *)(p_Var14 + 0x30 + (long)&(this->weight_winograd63_data).data),
             &this->weight_sgemm_data,num_input,iVar13,uVar11,iVar12);
LAB_0020931c:
  Mat::create(&this->scale_in_data,
              *(int *)(this->_vptr_Convolution_x86_fma[-3] + 0x30 +
                      (long)&(this->weight_winograd23_data).data),4,(Allocator *)0x0);
  pp_Var3 = this->_vptr_Convolution_x86_fma;
  p_Var4 = pp_Var3[-3];
  p_Var14 = (_func_int *)((long)&this->_vptr_Convolution_x86_fma + (long)p_Var4);
  if (0 < *(int *)(p_Var4 + 0x30 + (long)&(this->weight_winograd23_data).data)) {
    pvVar5 = (this->scale_in_data).data;
    lVar10 = 0;
    do {
      fVar1 = *(float *)(*(long *)(p_Var14 + 0x1f0) + lVar10 * 4);
      fVar18 = 0.0;
      if (fVar1 != 0.0) {
        fVar18 = 1.0 / (fVar1 * **(float **)(p_Var14 + 0x238));
      }
      *(float *)((long)pvVar5 + lVar10 * 4) = fVar18;
      lVar10 = lVar10 + 1;
      p_Var4 = pp_Var3[-3];
      p_Var14 = (_func_int *)((long)&this->_vptr_Convolution_x86_fma + (long)p_Var4);
    } while (lVar10 < *(int *)(p_Var4 + 0x30 + (long)&(this->weight_winograd23_data).data));
  }
  if (opt->lightmode != false) {
    piVar6 = *(int **)(p_Var14 + 0x168);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (*(long **)(p_Var14 + 0x180) == (long *)0x0) {
          if (*(void **)(p_Var14 + 0x160) != (void *)0x0) {
            free(*(void **)(p_Var14 + 0x160));
          }
        }
        else {
          (**(code **)(**(long **)(p_Var14 + 0x180) + 0x18))();
        }
      }
    }
    *(undefined8 *)(p_Var14 + 0x1a0) = 0;
    *(undefined8 *)(p_Var14 + 0x16c) = 0;
    *(undefined8 *)(p_Var14 + 0x174) = 0;
    *(undefined8 *)(p_Var14 + 0x160) = 0;
    *(undefined8 *)(p_Var14 + 0x168) = 0;
    *(undefined8 *)(p_Var14 + 0x188) = 0;
    *(undefined8 *)(p_Var14 + 400) = 0;
    *(undefined4 *)(p_Var14 + 0x198) = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_fma::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        elempack = num_input % 8 == 0 ? 8 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

#if __SSE2__
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 7 && kernel_h == 7 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd23_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_transform_kernel_int8_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
            // conv3x3s1_winograd43_transform_kernel_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            weight_data_tm = weight_data;
        }
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // requantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}